

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error __thiscall f2f::rounding(f2f *this,context *ctx,token *token,opcode *op)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  optional<unsigned_long> oVar4;
  int local_d4;
  token local_d0;
  string_view local_a8;
  _Storage<unsigned_long,_true> local_98;
  optional<unsigned_long> result;
  token local_80;
  int local_54 [5];
  undefined1 local_40 [8];
  optional<unsigned_long> result_1;
  int src_format;
  int dst_format;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  result_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = (uint)(op->value >> 8) & 3;
  result_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_4_ = (uint)(op->value >> 10) & 3;
  if (result_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._12_4_ ==
      result_1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_4_) {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)local_40);
    iVar2 = equal(token,".ROUND");
    if (iVar2 == 0) {
      iVar2 = equal(token,".FLOOR");
      if (iVar2 == 0) {
        iVar2 = equal(token,".CEIL");
        if (iVar2 == 0) {
          iVar2 = equal(token,".TRUNC");
          if (iVar2 == 0) {
            iVar2 = equal(token,".PASS");
            if (iVar2 != 0) {
              local_54[0] = 3;
              std::optional<unsigned_long>::operator=((optional<unsigned_long> *)local_40,local_54);
            }
          }
          else {
            local_54[1] = 0xb;
            std::optional<unsigned_long>::operator=
                      ((optional<unsigned_long> *)local_40,local_54 + 1);
          }
        }
        else {
          local_54[2] = 10;
          std::optional<unsigned_long>::operator=((optional<unsigned_long> *)local_40,local_54 + 2);
        }
      }
      else {
        local_54[3] = 9;
        std::optional<unsigned_long>::operator=((optional<unsigned_long> *)local_40,local_54 + 3);
      }
    }
    else {
      local_54[4] = 8;
      std::optional<unsigned_long>::operator=((optional<unsigned_long> *)local_40,local_54 + 4);
    }
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_40);
    if (bVar1) {
      context::tokenize(&local_80,ctx);
      memcpy(token,&local_80,0x24);
    }
    result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._12_4_ = 0;
    uVar3 = std::optional<unsigned_long>::value_or<int>
                      ((optional<unsigned_long> *)local_40,
                       (int *)&result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                               super__Optional_payload_base<unsigned_long>.field_0xc);
    opcode::add_bits(op,uVar3 << 0x27);
    memset(this,0,8);
    error::error((error *)this);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,".");
    oVar4 = find_in_table(token,rounding::table,local_a8);
    local_98._M_value =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_98);
    if (bVar1) {
      context::tokenize(&local_d0,ctx);
      memcpy(token,&local_d0,0x24);
    }
    local_d4 = 0;
    uVar3 = std::optional<unsigned_long>::value_or<int>
                      ((optional<unsigned_long> *)&local_98,&local_d4);
    opcode::add_bits(op,uVar3 << 0x27);
    memset(this,0,8);
    error::error((error *)this);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(rounding)
    {
        const int dst_format = (op.value >> 8) & 0b11;
        const int src_format = (op.value >> 10) & 0b11;
        if (dst_format == src_format) {
            std::optional<uint64_t> result;
            if (equal(token, ".ROUND")) {
                result = 0b1000;
            } else if (equal(token, ".FLOOR")) {
                result = 0b1001;
            } else if (equal(token, ".CEIL")) {
                result = 0b1010;
            } else if (equal(token, ".TRUNC")) {
                result = 0b1011;
            } else if (equal(token, ".PASS")) {
                result = 0b0011;
            }
            if (result) {
                token = ctx.tokenize();
            }
            op.add_bits(result.value_or(0) << 39);
            return {};
        }

        static const char* table[] = {"RN", "RM", "RP", "RZ", nullptr};
        const std::optional result = find_in_table(token, table, ".");
        if (result) {
            token = ctx.tokenize();
        }
        op.add_bits(result.value_or(0) << 39);
        return {};
    }